

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peers.cpp
# Opt level: O2

void __thiscall
Peers::peerIsConnected(Peers *this,unique_ptr<Peer,_std::default_delete<Peer>_> *peer)

{
  uint16_t uVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  mapped_type *this_00;
  Events *this_01;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar2;
  __uniq_ptr_impl<Peer,_std::default_delete<Peer>_> *this_02;
  vector<int,_std::allocator<int>_> ipPeers;
  _Vector_base<int,_std::allocator<int>_> local_50;
  string local_38;
  
  Peer::ip_abi_cxx11_(&local_38,
                      (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                      super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                      super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  ip2Peers((vector<int,_std::allocator<int>_> *)&local_50,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  uVar1 = Peer::port((peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                     super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                     super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  local_38._M_dataplus._M_p._0_4_ = (uint)uVar1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_50,(int *)&local_38);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_50._M_impl.super__Vector_impl_data._M_start,
             local_50._M_impl.super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (local_50._M_impl.super__Vector_impl_data._M_start,
                       local_50._M_impl.super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)&local_50,(const_iterator)__first._M_current,
             (const_iterator)local_50._M_impl.super__Vector_impl_data._M_finish);
  Peer::ip_abi_cxx11_(&local_38,
                      (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
                      super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
                      super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->m_ip2PeerMap,&local_38);
  std::vector<int,_std::allocator<int>_>::operator=
            (this_00,(vector<int,_std::allocator<int>_> *)&local_50);
  std::__cxx11::string::~string((string *)&local_38);
  this_01 = P2PSocket::events(this->m_p2pSocket);
  puVar2 = Events::onPeerConnect(this_01);
  Event::trigger<Peer*>
            ((puVar2->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
             super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
             super__Head_base<0UL,_Event_*,_false>._M_head_impl,
             (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
             super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
             super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  Peer::name_abi_cxx11_
            (&local_38,
             (peer->_M_t).super___uniq_ptr_impl<Peer,_std::default_delete<Peer>_>._M_t.
             super__Tuple_impl<0UL,_Peer_*,_std::default_delete<Peer>_>.
             super__Head_base<0UL,_Peer_*,_false>._M_head_impl);
  this_02 = (__uniq_ptr_impl<Peer,_std::default_delete<Peer>_> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Peer,_std::default_delete<Peer>_>_>_>_>
            ::operator[](&this->m_peers,&local_38);
  std::__uniq_ptr_impl<Peer,_std::default_delete<Peer>_>::operator=
            (this_02,(__uniq_ptr_impl<Peer,_std::default_delete<Peer>_> *)peer);
  std::__cxx11::string::~string((string *)&local_38);
  this->m_count = this->m_count + 1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void Peers::peerIsConnected(std::unique_ptr<Peer> peer)
{
    // Map multiple ports from same IP
    auto ipPeers = ip2Peers(peer->ip());
    ipPeers.push_back((peer->port()));

    std::sort(ipPeers.begin(), ipPeers.end());
    ipPeers.erase(unique(ipPeers.begin(), ipPeers.end()), ipPeers.end());
    m_ip2PeerMap[peer->ip()] = ipPeers;
    m_p2pSocket->events()->onPeerConnect()->trigger(peer.get());

    m_peers[peer->name()] = std::move(peer);
    ++m_count;
}